

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControl::drawContents(QWidgetTextControl *this,QPainter *p,QRectF *rect,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  QRectF *in_RDX;
  QRectF *in_RSI;
  long in_FS_OFFSET;
  QWidgetTextControlPrivate *d;
  PaintContext ctx;
  PaintContext *this_00;
  undefined1 local_58 [16];
  QWidget *in_stack_ffffffffffffffb8;
  QWidgetTextControl *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidgetTextControl *)0x72104f);
  QPainter::save();
  memcpy(local_58,&DAT_00b2a5b8,0x50);
  getPaintContext(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar2 = QRectF::isValid(in_RDX);
  if (bVar2) {
    QPainter::setClipRect(in_RSI,(ClipOperation)in_RDX);
  }
  plVar3 = (long *)QTextDocument::documentLayout();
  this_00 = (PaintContext *)local_58;
  (**(code **)(*plVar3 + 0x60))(plVar3,in_RSI);
  QPainter::restore();
  QAbstractTextDocumentLayout::PaintContext::~PaintContext(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControl::drawContents(QPainter *p, const QRectF &rect, QWidget *widget)
{
    Q_D(QWidgetTextControl);
    p->save();
    QAbstractTextDocumentLayout::PaintContext ctx = getPaintContext(widget);
    if (rect.isValid())
        p->setClipRect(rect, Qt::IntersectClip);
    ctx.clip = rect;

    d->doc->documentLayout()->draw(p, ctx);
    p->restore();
}